

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sethostname.c
# Opt level: O1

int gethostname(char *__name,size_t __len)

{
  int iVar1;
  char *__src;
  
  __src = getenv("CURL_GETHOSTNAME");
  if (__src == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    strncpy(__name,__src,__len);
    __name[__len - 1] = '\0';
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int gethostname(char *name, GETHOSTNAME_TYPE_ARG2 namelen)
{
  const char *force_hostname = getenv("CURL_GETHOSTNAME");
  if(force_hostname) {
    strncpy(name, force_hostname, namelen);
    name[namelen-1] = '\0';
    return 0;
  }

  /* LD_PRELOAD used, but no hostname set, we'll just return a failure */
  return -1;
}